

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_psrldq_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  int local_28;
  uint32_t local_24;
  int i;
  int shift;
  ZMMReg *s_local;
  ZMMReg *d_local;
  CPUX86State *env_local;
  
  local_24 = s->_l_ZMMReg[0];
  if (0x10 < (int)local_24) {
    local_24 = 0x10;
  }
  for (local_28 = 0; local_28 < (int)(0x10 - local_24); local_28 = local_28 + 1) {
    d->_b_ZMMReg[local_28] = d->_b_ZMMReg[(int)(local_28 + local_24)];
  }
  for (local_28 = 0x10 - local_24; local_28 < 0x10; local_28 = local_28 + 1) {
    d->_b_ZMMReg[local_28] = '\0';
  }
  return;
}

Assistant:

void glue(helper_psrldq, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int shift, i;

    shift = s->L(0);
    if (shift > 16) {
        shift = 16;
    }
    for (i = 0; i < 16 - shift; i++) {
        d->B(i) = d->B(i + shift);
    }
    for (i = 16 - shift; i < 16; i++) {
        d->B(i) = 0;
    }
}